

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O0

int mpt_data_convert_int16(int16_t *from,mpt_type_t type,void *dest)

{
  char cVar1;
  undefined1 uVar2;
  ushort **ppuVar3;
  iovec *vec;
  int16_t val;
  void *dest_local;
  mpt_type_t type_local;
  int16_t *from_local;
  
  vec._6_2_ = 0;
  if (from != (int16_t *)0x0) {
    vec._6_2_ = *from;
  }
  dest_local = (void *)type;
  if (type == 0x6c) {
    cVar1 = mpt_type_int(8);
    dest_local = (void *)(long)cVar1;
  }
  uVar2 = (undefined1)vec._6_2_;
  switch(dest_local) {
  case (void *)0x4e:
    if (dest == (void *)0x0) {
      from_local._4_4_ = -0x10;
    }
    else {
      *(int16_t **)dest = from;
      *(undefined8 *)((long)dest + 8) = 2;
      from_local._4_4_ = 0x10;
    }
    break;
  default:
    from_local._4_4_ = -3;
    break;
  case (void *)0x62:
    if ((vec._6_2_ < -0x80) || (0x7f < vec._6_2_)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    break;
  case (void *)0x63:
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)vec._6_2_] & 0x8000) == 0) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    break;
  case (void *)0x64:
    if (dest != (void *)0x0) {
      *(double *)dest = (double)(int)vec._6_2_;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x65:
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)vec._6_2_;
    }
    from_local._4_4_ = 0x10;
    break;
  case (void *)0x66:
    if (dest != (void *)0x0) {
      *(float *)dest = (float)(int)vec._6_2_;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x71:
    if (vec._6_2_ < 0) {
      return -2;
    }
  case (void *)0x6e:
    if (dest != (void *)0x0) {
      *(int16_t *)dest = vec._6_2_;
    }
    from_local._4_4_ = 2;
    break;
  case (void *)0x74:
    if (vec._6_2_ < 0) {
      return -2;
    }
  case (void *)0x78:
    if (dest != (void *)0x0) {
      *(long *)dest = (long)vec._6_2_;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x75:
    if (vec._6_2_ < 0) {
      return -2;
    }
  case (void *)0x69:
    if (dest != (void *)0x0) {
      *(int *)dest = (int)vec._6_2_;
    }
    from_local._4_4_ = 4;
    break;
  case (void *)0x79:
    if ((vec._6_2_ < 0) || (0xff < vec._6_2_)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
  }
  return from_local._4_4_;
}

Assistant:

extern int mpt_data_convert_int16(const int16_t *from, MPT_TYPE(type) type, void *dest)
{
	int16_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'b': if (val < INT8_MIN || val > INT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int8_t *) dest) = val;
			return sizeof(int8_t);
		case 'y': if (val < 0 || val > UINT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint8_t *) dest) = val;
			return sizeof(uint8_t);
		case 'q':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'n':
			if (dest) *((int16_t *) dest) = val;
			return sizeof(int16_t);
		case 'u':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'i':
			if (dest) *((int32_t *) dest) = val;
			return sizeof(int32_t);
		case 't':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'x':
			if (dest) *((int64_t *) dest) = val;
			return sizeof(int64_t);
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(int64_t);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
	#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(long double);
	#endif
		case MPT_type_toVector('n'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
				return sizeof(*vec);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
}